

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O0

TestStatus *
vkt::clipping::anon_unknown_0::ClipVolume::testPrimitivesOutside
          (TestStatus *__return_storage_ptr__,Context *context,VkPrimitiveTopology topology)

{
  VkPrimitiveTopology topology_00;
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  ProgramBinary *pPVar2;
  TestContext *this;
  MessageBuilder *pMVar3;
  allocator<char> local_6b1;
  string local_6b0;
  byte local_68b;
  byte local_68a;
  allocator<char> local_689;
  string local_688;
  Vector<float,_4> local_668;
  Vector<float,_4> local_658;
  ConstPixelBufferAccess local_648;
  int local_61c;
  undefined1 local_618 [4];
  int numBlackPixels;
  VulkanDrawContext drawContext;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  DrawState drawState;
  undefined1 local_3e8 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  int local_24c;
  undefined1 local_248 [4];
  int caseNdx;
  int local_c4;
  TestLog *pTStack_c0;
  int numPassed;
  TestLog *log;
  string local_b0;
  Shader local_90 [2];
  allocator<char> local_69;
  string local_68;
  Shader local_48;
  undefined1 local_38 [8];
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  VkPrimitiveTopology topology_local;
  Context *context_local;
  
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = topology;
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::vector
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_38);
  pPVar1 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"vert",&local_69);
  pPVar2 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,&local_68);
  drawutil::Shader::Shader(&local_48,VK_SHADER_STAGE_VERTEX_BIT,pPVar2);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_38,
             &local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pPVar1 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"frag",(allocator<char> *)((long)&log + 7));
  pPVar2 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,&local_b0);
  drawutil::Shader::Shader(local_90,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar2);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_38,
             local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&log + 7));
  this = Context::getTestContext(context);
  pTStack_c0 = tcu::TestContext::getLog(this);
  local_c4 = 0;
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_248,pTStack_c0,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_248,
                      (char (*) [70])
                      "Drawing primitives outside the clip volume. Expecting an empty image.");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_248);
  for (local_24c = 0; local_24c < 2; local_24c = local_24c + 1) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)
               &vertices.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,pTStack_c0,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)
                        &vertices.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        &testPrimitivesOutside::cases[local_24c].desc);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder
              ((MessageBuilder *)
               &vertices.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    topology_00 = shaders.
                  super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&drawState.lineWidth,0.0,0.0,
               testPrimitivesOutside::cases[local_24c].zPos,0.0);
    genVertices((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_3e8,
                topology_00,(Vec4 *)&drawState.lineWidth,0.0);
    drawutil::DrawState::DrawState
              ((DrawState *)((long)&drawCallData.vertices + 4),
               shaders.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x10,0x10);
    drawutil::DrawCallData::DrawCallData
              ((DrawCallData *)&vulkanProgram,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_3e8);
    drawutil::VulkanProgram::VulkanProgram
              ((VulkanProgram *)
               &drawContext.m_vertexBuffer.
                super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
                m_data.field_0x8,
               (vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_38);
    drawutil::VulkanDrawContext::VulkanDrawContext
              ((VulkanDrawContext *)local_618,context,
               (DrawState *)((long)&drawCallData.vertices + 4),(DrawCallData *)&vulkanProgram,
               (VulkanProgram *)
               &drawContext.m_vertexBuffer.
                super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
                m_data.field_0x8);
    drawutil::VulkanDrawContext::draw((VulkanDrawContext *)local_618);
    drawutil::VulkanDrawContext::getColorPixels(&local_648,(VulkanDrawContext *)local_618);
    tcu::Vector<float,_4>::Vector(&local_658,0.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(&local_668);
    local_61c = countPixels(&local_648,&local_658,&local_668);
    if (local_61c == 0x100) {
      local_c4 = local_c4 + 1;
    }
    drawutil::VulkanDrawContext::~VulkanDrawContext((VulkanDrawContext *)local_618);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_3e8);
  }
  local_68a = 0;
  local_68b = 0;
  if (local_c4 == 2) {
    std::allocator<char>::allocator();
    local_68a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"OK",&local_689);
    local_68b = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_688);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b0,"Rendered image(s) are incorrect",&local_6b1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_6b0);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator(&local_6b1);
  }
  if ((local_68b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_688);
  }
  if ((local_68a & 1) != 0) {
    std::allocator<char>::~allocator(&local_689);
  }
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::~vector
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testPrimitivesOutside (Context& context, const VkPrimitiveTopology topology)
{
	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));

	tcu::TestLog&	log			= context.getTestContext().getLog();
	int				numPassed	= 0;

	static const struct
	{
		const char* const	desc;
		float				zPos;
	} cases[] =
	{
		{ "Draw primitives in front of the near clipping plane, z < 0.0",	-0.5f, },
		{ "Draw primitives behind the far clipping plane, z > 1.0",			 1.5f, },
	};

	log << tcu::TestLog::Message << "Drawing primitives outside the clip volume. Expecting an empty image." << tcu::TestLog::EndMessage;

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
	{
		log << tcu::TestLog::Message << cases[caseNdx].desc << tcu::TestLog::EndMessage;

		const std::vector<Vec4> vertices = genVertices(topology, Vec4(0.0f, 0.0f, cases[caseNdx].zPos, 0.0f), 0.0f);
		DrawState				drawState		(topology, RENDER_SIZE, RENDER_SIZE);
		DrawCallData			drawCallData	(vertices);
		VulkanProgram			vulkanProgram	(shaders);

		VulkanDrawContext		drawContext(context, drawState, drawCallData, vulkanProgram);
		drawContext.draw();

		// All pixels must be black -- nothing is drawn.
		const int numBlackPixels = countPixels(drawContext.getColorPixels(), Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());
		if (numBlackPixels == NUM_RENDER_PIXELS)
			++numPassed;
	}

	return (numPassed == DE_LENGTH_OF_ARRAY(cases) ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}